

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageAnalyzer.cpp
# Opt level: O0

void __thiscall pageAnalyzer::decomposePageContent(pageAnalyzer *this)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_60;
  char i;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  int state;
  allocator local_31;
  string local_30 [8];
  string tmp;
  pageAnalyzer *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  __range1._0_4_ = 0x17;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_60._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa0), bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if ((int)__range1 == 0x17) {
      if (cVar1 == '<') {
        __range1._0_4_ = 0x18;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->pageContent,(value_type *)local_30);
        std::__cxx11::string::clear();
      }
      else {
        std::__cxx11::string::operator+=(local_30,cVar1);
      }
    }
    else if ((int)__range1 == 0x18) {
      if (cVar1 == '>') {
        __range1._0_4_ = 0x17;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->pageContent,(value_type *)local_30);
        std::__cxx11::string::clear();
      }
      else {
        std::__cxx11::string::operator+=(local_30,cVar1);
      }
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void pageAnalyzer::decomposePageContent()
{
    std::string tmp = std::string("");
    int state = OUTSIDE_ANGLEBRACKET;
    for (char i : this->inputPage)
    {
        if(state == OUTSIDE_ANGLEBRACKET)
        {
            if(i != '<')
                tmp += i;
            else
            {
                state = INSIDE_ANGLEBRACKET;
                this->pageContent.push_back(tmp);
                tmp.clear();
            }
        }
        else if(state == INSIDE_ANGLEBRACKET)
        {
            if(i != '>')
                tmp += i;
            else
            {
                state = OUTSIDE_ANGLEBRACKET;
                this->pageContent.push_back(tmp);
                tmp.clear();
            }
        }
        else;
    }
}